

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O2

LogicalType * __thiscall
duckdb::TypeVisitor::
VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_8_1_669485c1 *func)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *pLVar1;
  LogicalType *pLVar2;
  idx_t index;
  uint *func_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType LStack_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  optional_idx local_90;
  LogicalType local_88;
  LogicalType local_70;
  child_list_t<LogicalType> local_58;
  child_list_t<LogicalType> local_40;
  
  pLVar2 = &LStack_d8;
  func_00 = &switchD_0126248c::switchdataD_01fadb1c;
  switch(*this) {
  case (TypeVisitor)0x64:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0,__x);
    for (; (element_type *)local_c0._0_8_ !=
           local_c0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c0._0_8_ = local_c0._0_8_ + 0x38) {
      paVar3 = &(((element_type *)local_c0._0_8_)->alias).field_2;
      VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                (&LStack_d8,(TypeVisitor *)paVar3->_M_local_buf,type,
                 (anon_class_8_1_669485c1 *)func_00);
      LogicalType::operator=((LogicalType *)paVar3,&LStack_d8);
      LogicalType::~LogicalType(&LStack_d8);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_40,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0);
    LogicalType::STRUCT(&LStack_d8,&local_40);
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,&LStack_d8);
    LogicalType::~LogicalType(&LStack_d8);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_40;
    goto LAB_01262725;
  case (TypeVisitor)0x65:
    pLVar2 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar2);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_a8,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::LIST(&LStack_d8,&local_a8);
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,&LStack_d8);
    break;
  case (TypeVisitor)0x66:
    pLVar1 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar1);
    pLVar1 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&LStack_d8,pLVar1);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_70,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_88,(TypeVisitor *)&LStack_d8,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::MAP(&local_a8,&local_70,&local_88);
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,&local_a8);
    LogicalType::~LogicalType(&local_a8);
    LogicalType::~LogicalType(&local_88);
    LogicalType::~LogicalType(&local_70);
    goto LAB_0126268f;
  default:
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,(LogicalType *)this);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_c0,(UnionType *)this,type);
    for (; (element_type *)local_c0._0_8_ !=
           local_c0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c0._0_8_ = local_c0._0_8_ + 0x38) {
      paVar3 = &(((element_type *)local_c0._0_8_)->alias).field_2;
      VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                (&LStack_d8,(TypeVisitor *)paVar3->_M_local_buf,type,
                 (anon_class_8_1_669485c1 *)func_00);
      LogicalType::operator=((LogicalType *)paVar3,&LStack_d8);
      LogicalType::~LogicalType(&LStack_d8);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_58,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0);
    LogicalType::UNION(&LStack_d8,&local_58);
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,&LStack_d8);
    LogicalType::~LogicalType(&LStack_d8);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_58;
LAB_01262725:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_c0);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6c:
    pLVar2 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar2);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_a8,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_90,index);
    LogicalType::ARRAY(&LStack_d8,&local_a8,local_90);
    BuildProbeSideOptimizer::GetBuildSize::anon_class_8_1_669485c1::operator()
              (__return_storage_ptr__,(anon_class_8_1_669485c1 *)type,&LStack_d8);
  }
  LogicalType::~LogicalType(&LStack_d8);
  pLVar2 = &local_a8;
LAB_0126268f:
  LogicalType::~LogicalType(pLVar2);
  LogicalType::~LogicalType(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}